

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O1

size_t ptls_asn1_validation_recursive
                 (uint8_t *bytes,size_t bytes_max,int *decode_error,int level,
                 ptls_minicrypto_log_ctx_t *log_ctx)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  size_t sVar6;
  int indefinite_length;
  size_t local_60;
  uint8_t *local_58;
  int local_4c;
  uint32_t length;
  uint32_t type_number;
  int type_class;
  int structure_bit;
  size_t last_byte;
  
  structure_bit = 0;
  type_class = 0;
  type_number = 0;
  length = 0;
  indefinite_length = 0;
  last_byte = 0;
  local_60 = bytes_max;
  local_58 = bytes;
  sVar3 = ptls_asn1_read_type(bytes,bytes_max,&structure_bit,&type_class,&type_number,decode_error,
                              level,log_ctx);
  if ((log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) && (*decode_error == 0)) {
    ptls_asn1_print_type(type_class,type_number,level,log_ctx);
  }
  sVar6 = local_60;
  sVar3 = ptls_asn1_read_length
                    (local_58,local_60,sVar3,&length,&indefinite_length,&last_byte,decode_error,
                     level,log_ctx);
  sVar2 = last_byte;
  if (last_byte <= sVar6) {
    if (structure_bit == 0) {
      ptls_asn1_dump_content(local_58,last_byte,sVar3,log_ctx);
      sVar3 = sVar2;
    }
    else {
      if (log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) {
        (*log_ctx->fn)(log_ctx->ctx," {\n");
      }
      if (sVar3 < sVar2) {
        local_4c = indefinite_length;
        iVar5 = level + 1;
        sVar6 = sVar3;
        do {
          sVar3 = local_60;
          if ((local_4c != 0) && (local_58[sVar6] == '\0')) {
            uVar1 = sVar6 + 2;
            if ((local_60 < uVar1) || (local_58[sVar6 + 1] != '\0')) {
              ptls_asn1_error_message
                        ("EOC: unexpected end of content",local_60,sVar6,level + 1,log_ctx);
              *decode_error = 0x239;
            }
            else {
              sVar3 = uVar1;
              if (log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) {
                if (-1 < level) {
                  do {
                    (*log_ctx->fn)(log_ctx->ctx,"   ");
                    iVar5 = iVar5 + -1;
                  } while (iVar5 != 0);
                }
                (*log_ctx->fn)(log_ctx->ctx,"EOC\n");
              }
            }
            break;
          }
          sVar4 = ptls_asn1_validation_recursive
                            (local_58 + sVar6,sVar2 - sVar6,decode_error,iVar5,log_ctx);
          sVar3 = local_60;
          if (*decode_error != 0) break;
          sVar3 = sVar6 + sVar4;
          if (log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) {
            if (sVar3 < sVar2) {
              (*log_ctx->fn)(log_ctx->ctx,",");
            }
            (*log_ctx->fn)(log_ctx->ctx,"\n");
          }
          sVar6 = sVar3;
        } while (sVar3 < sVar2);
      }
      if (log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) {
        if (-1 < level) {
          iVar5 = level + 1;
          do {
            (*log_ctx->fn)(log_ctx->ctx,"   ");
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        (*log_ctx->fn)(log_ctx->ctx,"}");
      }
    }
  }
  return sVar3;
}

Assistant:

size_t ptls_asn1_validation_recursive(const uint8_t *bytes, size_t bytes_max, int *decode_error, int level,
                                      ptls_minicrypto_log_ctx_t *log_ctx)
{
    /* Get the type byte */
    int structure_bit = 0;
    int type_class = 0;
    uint32_t type_number = 0;
    uint32_t length = 0;
    int indefinite_length = 0;
    size_t last_byte = 0;
    /* Decode the type */
    size_t byte_index =
        ptls_asn1_read_type(bytes, bytes_max, &structure_bit, &type_class, &type_number, decode_error, level, log_ctx);

    if (*decode_error == 0 && log_ctx != NULL) {
        ptls_asn1_print_type(type_class, type_number, level, log_ctx);
    }

    /* Get the length */
    byte_index =
        ptls_asn1_read_length(bytes, bytes_max, byte_index, &length, &indefinite_length, &last_byte, decode_error, level, log_ctx);

    if (last_byte <= bytes_max) {
        if (structure_bit) {
            /* If structured, recurse on a loop */
            if (log_ctx != NULL) {
                log_ctx->fn(log_ctx->ctx, " {\n");
            }

            while (byte_index < last_byte) {
                if (indefinite_length != 0 && bytes[byte_index] == 0) {
                    if (byte_index + 2 > bytes_max || bytes[byte_index + 1] != 0) {
                        byte_index =
                            ptls_asn1_error_message("EOC: unexpected end of content", bytes_max, byte_index, level + 1, log_ctx);

                        *decode_error = PTLS_ERROR_BER_UNEXPECTED_EOC;
                        byte_index = bytes_max;
                        break;
                    } else {
                        if (log_ctx != NULL) {
                            ptls_asn1_print_indent(level, log_ctx);
                            log_ctx->fn(log_ctx->ctx, "EOC\n");
                        }
                        byte_index += 2;
                        break;
                    }
                } else {
                    byte_index += ptls_asn1_validation_recursive(bytes + byte_index, last_byte - byte_index, decode_error,
                                                                 level + 1, log_ctx);

                    if (*decode_error) {
                        byte_index = bytes_max;
                        break;
                    }
                }

                if (log_ctx != NULL) {
                    if (byte_index < last_byte) {
                        log_ctx->fn(log_ctx->ctx, ",");
                    }
                    log_ctx->fn(log_ctx->ctx, "\n");
                }
            }

            if (log_ctx != NULL) {
                ptls_asn1_print_indent(level, log_ctx);
                log_ctx->fn(log_ctx->ctx, "}");
            }
        } else {
            ptls_asn1_dump_content(bytes, last_byte, byte_index, log_ctx);
            byte_index = last_byte;
        }
    }

    return byte_index;
}